

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O1

token * dmrC_assignment_expression(dmr_C *C,token *token,expression **tree)

{
  uint uVar1;
  position pVar2;
  ulong uVar3;
  token *ptVar4;
  ulong uVar5;
  expression *peVar6;
  token *ptVar7;
  bool bVar8;
  
  ptVar4 = dmrC_conditional_expression(C,token,tree);
  if ((*tree != (expression *)0x0) && (pVar2 = ptVar4->pos, (pVar2._0_4_ & 0x3f) == 0x11)) {
    uVar1 = (ptVar4->field_2).special;
    if (uVar1 == 0x3d) {
      bVar8 = false;
    }
    else {
      uVar3 = 0;
      do {
        uVar5 = uVar3;
        bVar8 = 9 < uVar5;
        if (uVar5 == 10) {
          ptVar7 = (token *)0xa;
          goto LAB_00108d34;
        }
        uVar3 = uVar5 + 1;
      } while (dmrC_assignment_expression::assignments[uVar5 + 1] != uVar1);
      bVar8 = 9 < uVar5;
    }
    peVar6 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
    *(undefined1 *)peVar6 = 6;
    peVar6->pos = pVar2;
    (peVar6->field_5).field_3.unop = *tree;
    peVar6->op = uVar1;
    *tree = peVar6;
    ptVar7 = dmrC_assignment_expression(C,ptVar4->next,&(peVar6->field_5).field_6.right);
LAB_00108d34:
    if (!bVar8) {
      return ptVar7;
    }
  }
  return ptVar4;
}

Assistant:

struct token *dmrC_assignment_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	token = dmrC_conditional_expression(C, token, tree);
	if (*tree && dmrC_token_type(token) == TOKEN_SPECIAL) {
		static const int assignments[] = {
			'=',
			SPECIAL_ADD_ASSIGN, SPECIAL_SUB_ASSIGN,
			SPECIAL_MUL_ASSIGN, SPECIAL_DIV_ASSIGN,
			SPECIAL_MOD_ASSIGN, SPECIAL_SHL_ASSIGN,
			SPECIAL_SHR_ASSIGN, SPECIAL_AND_ASSIGN,
			SPECIAL_OR_ASSIGN,  SPECIAL_XOR_ASSIGN };
		int i, op = token->special;
		for (i = 0; i < (int)ARRAY_SIZE(assignments); i++)
			if (assignments[i] == op) {
				struct expression * expr = dmrC_alloc_expression(C, token->pos, EXPR_ASSIGNMENT);
				expr->left = *tree;
				expr->op = op;
				*tree = expr;
				return dmrC_assignment_expression(C, token->next, &expr->right);
			}
	}
	return token;
}